

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::snapshot::serialize(snapshot *this)

{
  element_type *this_00;
  buffer *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<buffer> pVar1;
  cluster_config *in_stack_00000038;
  ptr<buffer> conf_buf;
  ptr<buffer> *buf;
  size_t in_stack_000000e8;
  element_type *this_02;
  undefined1 *p;
  undefined7 in_stack_ffffffffffffffc8;
  byte in_stack_ffffffffffffffcf;
  buffer *in_stack_ffffffffffffffd0;
  undefined1 local_20 [8];
  buffer *in_stack_ffffffffffffffe8;
  
  this_02 = in_RDI;
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1e773e);
  p = local_20;
  cluster_config::serialize(in_stack_00000038);
  this_00 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1e775f);
  this_01 = (buffer *)buffer::size(this_00);
  buffer::alloc(in_stack_000000e8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e778d);
  buffer::put(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e77aa);
  buffer::put(in_stack_ffffffffffffffd0,
              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e77c6);
  buffer::put(in_stack_ffffffffffffffd0,
              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e77e3);
  buffer::put(in_stack_ffffffffffffffd0,
              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e7800);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_02);
  buffer::put(in_RSI,in_stack_ffffffffffffffe8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e7826);
  buffer::pos(this_01,(size_t)p);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1e7880);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> snapshot::serialize() {
    ptr<buffer> conf_buf = last_config_->serialize();
    ptr<buffer> buf = buffer::alloc(conf_buf->size() + sz_ulong * 3 + sz_byte);
    buf->put((byte)type_);
    buf->put(last_log_idx_);
    buf->put(last_log_term_);
    buf->put(size_);
    buf->put(*conf_buf);
    buf->pos(0);
    return buf;
}